

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::FormattingScene::TransformBegin(FormattingScene *this,FileLoc loc)

{
  long in_RDI;
  string local_28 [12];
  int in_stack_ffffffffffffffe4;
  FormattingScene *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  indent_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  Printf<std::__cxx11::string>
            (in_stack_fffffffffffffff0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_28);
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 4;
  return;
}

Assistant:

void FormattingScene::TransformBegin(FileLoc loc) {
    Printf("%sTransformBegin\n", indent());
    catIndentCount += 4;
}